

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_59::Register(anon_unknown_59 *this,ExtensionInfo *info)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  undefined8 *puVar3;
  ctrl_t *pcVar4;
  undefined1 *capacity;
  long lVar5;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *this_00;
  uint uVar6;
  ushort uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *this_01;
  bool bVar13;
  int iVar14;
  LogMessage *pLVar15;
  size_t sVar16;
  ExtensionInfo *pEVar17;
  uintptr_t v;
  uint64_t v_3;
  undefined1 uVar18;
  ulong uVar19;
  const_iterator *b;
  uint uVar20;
  const_iterator *a;
  ushort uVar21;
  long lVar22;
  PolicyFunctions *pPVar23;
  PolicyFunctions *policy;
  HeapOrSoo *pHVar24;
  uint uVar25;
  ulong uVar26;
  CommonFields *common;
  ulong uVar27;
  __m128i match;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  string_view sVar38;
  string_view str;
  FindInfo target;
  LogMessage local_48;
  int local_34;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  
  if ((internal::(anonymous_namespace)::Register(google::protobuf::internal::ExtensionInfo_const&)::
       local_static_registry == '\0') &&
     (iVar14 = __cxa_guard_acquire(&internal::(anonymous_namespace)::
                                    Register(google::protobuf::internal::ExtensionInfo_const&)::
                                    local_static_registry), iVar14 != 0)) {
    pEVar17 = (ExtensionInfo *)operator_new(0x20);
    pEVar17->message = (MessageLite *)0x0;
    pEVar17->number = 0;
    pEVar17->type = '\0';
    pEVar17->is_repeated = false;
    pEVar17->is_packed = false;
    pEVar17->is_lazy = kUndefined;
    (pEVar17->field_6).enum_validity_check.func = (EnumValidityFuncWithArg *)0x49d790;
    info = pEVar17;
    OnShutdownRun(OnShutdownDelete<absl::lts_20250127::flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>_>
                  ::anon_class_1_0_00000001::__invoke,pEVar17);
    Register::local_static_registry =
         (flat_hash_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
          *)pEVar17;
    __cxa_guard_release(&internal::(anonymous_namespace)::
                         Register(google::protobuf::internal::ExtensionInfo_const&)::
                         local_static_registry);
  }
  this_01 = Register::local_static_registry;
  internal::(anonymous_namespace)::global_registry = Register::local_static_registry;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  ::AssertOnFind<google::protobuf::internal::ExtensionInfo>
            (&Register::local_static_registry->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ,info);
  pcVar4 = (this_01->
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
           ).settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  capacity = (undefined1 *)
             (this_01->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
  if (((ulong)(capacity + 1) & (ulong)capacity) == 0) {
    uVar19 = *(ulong *)this;
    uVar26 = (uVar19 ^ 0x572bb8) * -0x234dd359734ecb13;
    uVar26 = ((uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
              | uVar26 << 0x38) ^ uVar19) * -0x234dd359734ecb13;
    uVar26 = ((uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
               (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
               (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28
              | uVar26 << 0x38) ^ (ulong)*(uint *)(this + 8)) * -0x234dd359734ecb13;
    common = (CommonFields *)
             (uVar26 >> 0x38 | (uVar26 & 0xff000000000000) >> 0x28 |
              (uVar26 & 0xff0000000000) >> 0x18 | (uVar26 & 0xff00000000) >> 8 |
              (uVar26 & 0xff000000) << 8 | (uVar26 & 0xff0000) << 0x18 | (uVar26 & 0xff00) << 0x28 |
             uVar26 << 0x38);
    uVar27 = (ulong)common >> 7 ^ (ulong)pcVar4 >> 0xc;
    uVar18 = (undefined1)(uVar26 >> 0x38);
    auVar28 = ZEXT216(CONCAT11(uVar18,uVar18) & 0x7f7f);
    auVar28 = pshuflw(auVar28,auVar28,0);
    lVar5 = *(long *)((long)&(this_01->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                             ).settings_.
                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                             .value.heap_or_soo_ + 8);
    pPVar23 = (PolicyFunctions *)0x0;
    while( true ) {
      uVar27 = uVar27 & (ulong)capacity;
      pcVar1 = pcVar4 + uVar27;
      cVar31 = auVar28[0];
      auVar33[0] = -(cVar31 == *pcVar1);
      cVar32 = auVar28[1];
      auVar33[1] = -(cVar32 == pcVar1[1]);
      cVar35 = auVar28[2];
      auVar33[2] = -(cVar35 == pcVar1[2]);
      cVar36 = auVar28[3];
      auVar33[3] = -(cVar36 == pcVar1[3]);
      auVar33[4] = -(cVar31 == pcVar1[4]);
      auVar33[5] = -(cVar32 == pcVar1[5]);
      auVar33[6] = -(cVar35 == pcVar1[6]);
      auVar33[7] = -(cVar36 == pcVar1[7]);
      auVar33[8] = -(cVar31 == pcVar1[8]);
      auVar33[9] = -(cVar32 == pcVar1[9]);
      auVar33[10] = -(cVar35 == pcVar1[10]);
      auVar33[0xb] = -(cVar36 == pcVar1[0xb]);
      auVar33[0xc] = -(cVar31 == pcVar1[0xc]);
      auVar33[0xd] = -(cVar32 == pcVar1[0xd]);
      auVar33[0xe] = -(cVar35 == pcVar1[0xe]);
      auVar33[0xf] = -(cVar36 == pcVar1[0xf]);
      uVar21 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
      uVar20 = (uint)uVar21;
      while (uVar21 != 0) {
        uVar25 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
          }
        }
        lVar22 = (uVar25 + uVar27 & (ulong)capacity) * 0x30;
        if ((*(ulong *)(lVar5 + lVar22) == uVar19) &&
           (*(uint *)(lVar5 + 8 + lVar22) == *(uint *)(this + 8))) {
          if (pcVar4 != (ctrl_t *)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_48,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                       ,0x65);
            sVar38._M_str = "Multiple extension registrations for type \"";
            sVar38._M_len = 0x2b;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_48,sVar38);
            sVar38 = MessageLite::GetTypeName(*(MessageLite **)this);
            pLVar15 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_48,sVar38);
            str._M_str = "\", field number ";
            str._M_len = 0x10;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (pLVar15,str);
            local_34 = *(int *)(this + 8);
            pLVar15 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                                (pLVar15,&local_34);
            absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar15,(char (*) [2])0x40fa72)
            ;
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_48);
          }
          goto LAB_0027f5f1;
        }
        uVar21 = (ushort)(uVar20 - 1) & (ushort)uVar20;
        uVar20 = CONCAT22((short)(uVar20 - 1 >> 0x10),uVar21);
      }
      auVar29[0] = -(*pcVar1 == kEmpty);
      auVar29[1] = -(pcVar1[1] == kEmpty);
      auVar29[2] = -(pcVar1[2] == kEmpty);
      auVar29[3] = -(pcVar1[3] == kEmpty);
      auVar29[4] = -(pcVar1[4] == kEmpty);
      auVar29[5] = -(pcVar1[5] == kEmpty);
      auVar29[6] = -(pcVar1[6] == kEmpty);
      auVar29[7] = -(pcVar1[7] == kEmpty);
      auVar29[8] = -(pcVar1[8] == kEmpty);
      auVar29[9] = -(pcVar1[9] == kEmpty);
      auVar29[10] = -(pcVar1[10] == kEmpty);
      auVar29[0xb] = -(pcVar1[0xb] == kEmpty);
      auVar29[0xc] = -(pcVar1[0xc] == kEmpty);
      auVar29[0xd] = -(pcVar1[0xd] == kEmpty);
      auVar29[0xe] = -(pcVar1[0xe] == kEmpty);
      auVar29[0xf] = -(pcVar1[0xf] == kEmpty);
      uVar21 = (ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf;
      if (uVar21 != 0) break;
      uVar27 = (long)&pPVar23->hash_slot + uVar27;
      pPVar23 = (PolicyFunctions *)&pPVar23->hash_slot;
      if (capacity < pPVar23) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                     );
      }
    }
    policy = pPVar23;
    bVar13 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                       ((size_t)capacity,(size_t)common,pcVar4);
    if (bVar13) {
      uVar7 = 0xf;
      if (uVar21 != 0) {
        for (; uVar21 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar20 = (ushort)((uVar7 ^ 0xfff0) + 0x11) - 1;
    }
    else {
      uVar20 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
        }
      }
    }
    target.probe_length =
         (size_t)absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>
                 ::GetPolicyFunctions()::value;
    target.offset = (size_t)pPVar23;
    sVar16 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                       ((container_internal *)this_01,common,uVar20 + uVar27 & (ulong)capacity,
                        target,policy);
    pcVar4 = (this_01->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             heap_or_soo_.heap.control;
    if (pcVar4 == (ctrl_t *)0x0) {
LAB_0027f5f1:
      __assert_fail("ctrl != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x9ef,
                    "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>]"
                   );
    }
    pEVar17 = (ExtensionInfo *)
              (this_01->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
              ).settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .capacity_;
    lVar5 = *(long *)((long)&(this_01->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                             ).settings_.
                             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                             .
                             super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                             .value.heap_or_soo_ + 8);
    lVar22 = sVar16 * 0x30;
    (this_01->
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ).settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 0xffffffffffffff9c;
    uVar8 = *(undefined8 *)this;
    uVar9 = *(undefined8 *)(this + 8);
    uVar10 = *(undefined8 *)(this + 0x10);
    uVar11 = *(undefined8 *)(this + 0x18);
    uVar12 = *(undefined8 *)(this + 0x28);
    puVar3 = (undefined8 *)(lVar5 + 0x20 + lVar22);
    *puVar3 = *(undefined8 *)(this + 0x20);
    puVar3[1] = uVar12;
    puVar3 = (undefined8 *)(lVar5 + 0x10 + lVar22);
    *puVar3 = uVar10;
    puVar3[1] = uVar11;
    *(undefined8 *)(lVar5 + lVar22) = uVar8;
    ((undefined8 *)(lVar5 + lVar22))[1] = uVar9;
    absl::lts_20250127::container_internal::CommonFields::set_capacity
              ((CommonFields *)this_01,(size_t)pEVar17);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ::iterator::operator*((iterator *)(pcVar4 + sVar16));
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
    ::AssertOnFind<google::protobuf::internal::ExtensionInfo>
              (&this_01->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               ,pEVar17);
    pcVar4 = (this_01->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             heap_or_soo_.heap.control;
    this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
               *)(this_01->
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                 ).settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
    if (((ulong)((long)&(this_00->settings_).
                        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                        .value.capacity_ + 1U) & (ulong)this_00) == 0) {
      pcVar1 = *(ctrl_t **)(lVar5 + lVar22);
      uVar20 = *(uint *)(lVar5 + 8 + lVar22);
      uVar19 = ((ulong)pcVar1 ^ 0x572bb8) * -0x234dd359734ecb13;
      uVar19 = ((uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                 (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                 (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                 (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38) ^ (ulong)pcVar1) * -0x234dd359734ecb13;
      uVar19 = ((uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                 (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                 (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                 (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38) ^ (ulong)uVar20) * -0x234dd359734ecb13;
      uVar26 = (uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 | (uVar19 & 0xff00) << 0x28
               | uVar19 << 0x38) >> 7 ^ (ulong)pcVar4 >> 0xc;
      uVar18 = (undefined1)(uVar19 >> 0x38);
      auVar28 = ZEXT216(CONCAT11(uVar18,uVar18) & 0x7f7f);
      auVar28 = pshuflw(auVar28,auVar28,0);
      b = *(const_iterator **)
           ((long)&(this_01->
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
                   ).settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_ + 8);
      pHVar24 = (HeapOrSoo *)0x0;
      do {
        uVar26 = uVar26 & (ulong)this_00;
        pcVar2 = pcVar4 + uVar26;
        cVar31 = pcVar2[0xf];
        cVar32 = auVar28[0];
        auVar34[0] = -(cVar32 == *pcVar2);
        cVar35 = auVar28[1];
        auVar34[1] = -(cVar35 == pcVar2[1]);
        cVar36 = auVar28[2];
        auVar34[2] = -(cVar36 == pcVar2[2]);
        cVar37 = auVar28[3];
        auVar34[3] = -(cVar37 == pcVar2[3]);
        auVar34[4] = -(cVar32 == pcVar2[4]);
        auVar34[5] = -(cVar35 == pcVar2[5]);
        auVar34[6] = -(cVar36 == pcVar2[6]);
        auVar34[7] = -(cVar37 == pcVar2[7]);
        auVar34[8] = -(cVar32 == pcVar2[8]);
        auVar34[9] = -(cVar35 == pcVar2[9]);
        auVar34[10] = -(cVar36 == pcVar2[10]);
        auVar34[0xb] = -(cVar37 == pcVar2[0xb]);
        auVar34[0xc] = -(cVar32 == pcVar2[0xc]);
        auVar34[0xd] = -(cVar35 == pcVar2[0xd]);
        auVar34[0xe] = -(cVar36 == pcVar2[0xe]);
        auVar34[0xf] = -(cVar37 == cVar31);
        uVar21 = (ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf
        ;
        uVar25 = (uint)uVar21;
        while (uVar21 != 0) {
          uVar6 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar19 = uVar6 + uVar26 & (ulong)this_00;
          if ((b[uVar19 * 3].inner_.ctrl_ == pcVar1) &&
             (*(uint *)&b[uVar19 * 3].inner_.field_1 == uVar20)) {
            if (pcVar4 == (ctrl_t *)0x0) goto LAB_0027f5f1;
            b = b + uVar19 * 3;
            a = (const_iterator *)(pcVar4 + uVar19);
            goto LAB_0027f5cf;
          }
          uVar21 = (ushort)(uVar25 - 1) & (ushort)uVar25;
          uVar25 = CONCAT22((short)(uVar25 - 1 >> 0x10),uVar21);
        }
        auVar30[0] = -(*pcVar2 == kEmpty);
        auVar30[1] = -(pcVar2[1] == kEmpty);
        auVar30[2] = -(pcVar2[2] == kEmpty);
        auVar30[3] = -(pcVar2[3] == kEmpty);
        auVar30[4] = -(pcVar2[4] == kEmpty);
        auVar30[5] = -(pcVar2[5] == kEmpty);
        auVar30[6] = -(pcVar2[6] == kEmpty);
        auVar30[7] = -(pcVar2[7] == kEmpty);
        auVar30[8] = -(pcVar2[8] == kEmpty);
        auVar30[9] = -(pcVar2[9] == kEmpty);
        auVar30[10] = -(pcVar2[10] == kEmpty);
        auVar30[0xb] = -(pcVar2[0xb] == kEmpty);
        auVar30[0xc] = -(pcVar2[0xc] == kEmpty);
        auVar30[0xd] = -(pcVar2[0xd] == kEmpty);
        auVar30[0xe] = -(pcVar2[0xe] == kEmpty);
        auVar30[0xf] = -(cVar31 == kEmpty);
        if ((((((((((((((((auVar30 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar30 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar30 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar30 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar30 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar30 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar30 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar30 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar30 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar30 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar30 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar30 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar31 == kEmpty)
        {
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
          ::AssertNotDebugCapacity(this_00);
          a = (const_iterator *)0x0;
LAB_0027f5cf:
          bVar13 = absl::lts_20250127::container_internal::operator==(a,b);
          if (bVar13) {
            return;
          }
          __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xfe2,
                        "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, Args = <const google::protobuf::internal::ExtensionInfo &>]"
                       );
        }
        uVar26 = (long)pHVar24 + uVar26 + 0x10;
        pHVar24 = pHVar24 + 1;
        if (this_00 < pHVar24) {
          __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xe37,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, google::protobuf::internal::(anonymous namespace)::ExtensionHasher, google::protobuf::internal::(anonymous namespace)::ExtensionEq, std::allocator<google::protobuf::internal::ExtensionInfo>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::internal::ExtensionInfo>, Hash = google::protobuf::internal::(anonymous namespace)::ExtensionHasher, Eq = google::protobuf::internal::(anonymous namespace)::ExtensionEq, Alloc = std::allocator<google::protobuf::internal::ExtensionInfo>, K = google::protobuf::internal::ExtensionInfo]"
                       );
        }
      } while( true );
    }
  }
  __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x14c,
                "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
}

Assistant:

void Register(const ExtensionInfo& info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!local_static_registry->insert(info).second) {
    ABSL_LOG(FATAL) << "Multiple extension registrations for type \""
                    << info.message->GetTypeName() << "\", field number "
                    << info.number << ".";
  }
}